

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall
Hpipe::Instruction::apply_rec_rewind_l
          (Instruction *this,function<void_(Hpipe::Instruction_*,_unsigned_int)> *f,
          uint rewind_level)

{
  Instruction *pIVar1;
  bool bVar2;
  function<void_(Hpipe::Instruction_*,_unsigned_int)> local_60;
  reference local_40;
  Transition *t;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::Transition> *__range1;
  uint rewind_level_local;
  function<void_(Hpipe::Instruction_*,_unsigned_int)> *f_local;
  Instruction *this_local;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    std::function<void_(Hpipe::Instruction_*,_unsigned_int)>::operator()(f,this,rewind_level);
    __end1 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                       (&(this->next).
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    t = (Transition *)
        std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end
                  (&(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                  );
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                                       *)&t), bVar2) {
      local_40 = __gnu_cxx::
                 __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                 ::operator*(&__end1);
      pIVar1 = local_40->inst;
      std::function<void_(Hpipe::Instruction_*,_unsigned_int)>::function(&local_60,f);
      (*pIVar1->_vptr_Instruction[9])(pIVar1,&local_60,(ulong)rewind_level);
      std::function<void_(Hpipe::Instruction_*,_unsigned_int)>::~function(&local_60);
      __gnu_cxx::
      __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Instruction::apply_rec_rewind_l( std::function<void (Instruction *, unsigned)> f, unsigned rewind_level ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    f( this, rewind_level );

    for( Transition &t : next )
        t.inst->apply_rec_rewind_l( f, rewind_level );
}